

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O0

void __thiscall NULLC::TraceContext::~TraceContext(TraceContext *this)

{
  TraceContext *this_local;
  
  TraceDump();
  if ((this->output).stream != (void *)0x0) {
    OutputContext::Print(&this->output,']');
    OutputContext::Flush(&this->output);
    (*(this->output).closeStream)((this->output).stream);
    (this->output).stream = (void *)0x0;
  }
  TraceArray<char>::~TraceArray(&this->tempBuf);
  TraceArray<char>::~TraceArray(&this->outputBuf);
  TraceArray<NULLC::TraceEvent>::~TraceArray(&this->events);
  TraceArray<char>::~TraceArray(&this->labels);
  TraceArray<NULLC::TraceScopeToken>::~TraceArray(&this->scopeTokens);
  OutputContext::~OutputContext(&this->output);
  return;
}

Assistant:

~TraceContext()
		{
			TraceDump();

			if(output.stream)
			{
				output.Print(']');
				output.Flush();

				output.closeStream(output.stream);
				output.stream = NULL;
			}
		}